

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void * multi_thread_client_shutdown(void *args)

{
  fdb_status fVar1;
  char *__format;
  int iVar2;
  void *local_178 [2];
  pthread_t local_168;
  code *pcStack_160;
  fdb_config local_150;
  undefined1 local_58 [8];
  timeval __test_begin;
  fdb_file_handle *tdbfile;
  
  iVar2 = 0;
  pcStack_160 = (code *)0x10b70e;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  if (args == (void *)0x0) {
    pcStack_160 = (code *)0x10b71c;
    memleak_start();
    pcStack_160 = (code *)0x10b728;
    system("rm -rf  dummy* > errorlog.txt");
    while (iVar2 < 2) {
      local_150._0_4_ = iVar2;
      pthread_create(&local_168 + iVar2,(pthread_attr_t *)0x0,multi_thread_client_shutdown,
                     &local_150);
      iVar2 = local_150._0_4_ + 1;
    }
    for (local_150._0_4_ = 0; (int)local_150._0_4_ < 2; local_150._0_4_ = local_150._0_4_ + 1) {
      pthread_join((&local_168)[(int)local_150._0_4_],local_178 + (int)local_150._0_4_);
    }
    memleak_end();
    __format = "%s PASSED\n";
    if (multi_thread_client_shutdown(void*)::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"multi thread client shutdown");
    return (void *)0x0;
  }
  pcStack_160 = (code *)0x10b7f3;
  fdb_get_default_config();
  pcStack_160 = (code *)0x10b7fc;
  fdb_get_default_kvs_config();
  local_150.wal_threshold = 0x400;
  local_150.compaction_threshold = '\0';
  pcStack_160 = (code *)0x10b81b;
  fVar1 = fdb_open((fdb_file_handle **)&__test_begin.tv_usec,"./dummy1",&local_150);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_160 = (code *)0x10b828;
    fVar1 = fdb_close((fdb_file_handle *)__test_begin.tv_usec);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_160 = (code *)0x10b850;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x7dd);
      multi_thread_client_shutdown(void*)::__test_pass = '\x01';
      pcStack_160 = (code *)0x10b860;
      fVar1 = fdb_close((fdb_file_handle *)__test_begin.tv_usec);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_160 = (code *)0x10b88f;
        __assert_fail("fdb_close(tdbfile) == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x7dd,"void *multi_thread_client_shutdown(void *)");
      }
    }
    pcStack_160 = (code *)0x10b869;
    fdb_shutdown();
    pcStack_160 = (code *)0x10b870;
    pthread_exit((void *)0x0);
  }
  pcStack_160 = (code *)0x10b8b6;
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x7dc);
  multi_thread_client_shutdown(void*)::__test_pass = 1;
  pcStack_160 = multi_thread_kvs_client;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x7dc,"void *multi_thread_client_shutdown(void *)");
}

Assistant:

void *multi_thread_client_shutdown(void *args)
{

    TEST_INIT();

    int i, r;
    int nclients;
    fdb_file_handle *tdbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;
        nclients = 2;
        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            thread_create(&tid[i], multi_thread_client_shutdown, (void *)&i);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // threads enter here //

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    // open/close db
    status = fdb_open(&tdbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(fdb_close(tdbfile) == FDB_RESULT_SUCCESS);

    // shutdown
    fdb_shutdown();
    thread_exit(0);
    return NULL;
}